

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  ImVec2 IVar1;
  uint uVar2;
  ImGuiViewportP *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  ImVec2 *ref_pos;
  ImGuiPopupPositionPolicy policy;
  ImGuiContext *g;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 tooltip_pos;
  ImRect r_outer;
  ImRect local_58;
  ImVec2 local_40;
  ImRect local_38;
  undefined1 local_28 [16];
  
  pIVar5 = GImGui;
  pIVar3 = *(GImGui->Viewports).Data;
  IVar1 = (pIVar3->super_ImGuiViewport).Pos;
  local_38.Min.x = IVar1.x;
  local_38.Min.y = IVar1.y;
  IVar1 = (pIVar3->super_ImGuiViewport).Size;
  fVar6 = IVar1.x + local_38.Min.x;
  fVar7 = IVar1.y + local_38.Min.y;
  IVar1 = (GImGui->Style).DisplaySafeAreaPadding;
  fVar8 = IVar1.x;
  fVar9 = IVar1.y;
  local_38.Max.x = (float)((uint)-fVar8 & -(uint)(fVar8 + fVar8 < fVar6 - local_38.Min.x));
  local_38.Max.y = (float)((uint)-fVar9 & -(uint)(fVar9 + fVar9 < fVar7 - local_38.Min.y));
  local_38.Min.x = local_38.Min.x - local_38.Max.x;
  local_38.Min.y = local_38.Min.y - local_38.Max.y;
  local_38.Max.x = local_38.Max.x + fVar6;
  local_38.Max.y = local_38.Max.y + fVar7;
  uVar2 = window->Flags;
  if ((uVar2 >> 0x1c & 1) == 0) {
    if ((uVar2 >> 0x1a & 1) != 0) {
      local_58.Min = window->Pos;
      local_58.Max = local_58.Min;
      goto LAB_00188c77;
    }
    if ((uVar2 >> 0x19 & 1) == 0) {
      fVar6 = (window->Pos).x;
      fVar7 = (window->Pos).y;
      goto LAB_00188c87;
    }
    local_28 = ZEXT416((uint)(GImGui->Style).MouseCursorScale);
    IVar1 = NavCalcPreferredRefPos();
    fVar6 = IVar1.x;
    fVar7 = IVar1.y;
    local_40.y = (float)local_28._0_4_ * 10.0 + fVar7;
    local_40.x = (float)local_28._0_4_ * 16.0 + fVar6;
    if (((pIVar5->NavDisableHighlight == false) && (pIVar5->NavDisableMouseHover == true)) &&
       (((pIVar5->IO).ConfigFlags & 4) == 0)) {
      fVar8 = 16.0;
      fVar9 = 8.0;
    }
    else {
      fVar8 = (float)local_28._0_4_ * 24.0;
      fVar9 = (float)local_28._0_4_ * 24.0;
    }
    local_58.Min.y = fVar7 + -8.0;
    local_58.Min.x = fVar6 + -16.0;
    local_58.Max.y = fVar9 + fVar7;
    local_58.Max.x = fVar8 + fVar6;
    ref_pos = &local_40;
    policy = ImGuiPopupPositionPolicy_Tooltip;
  }
  else {
    pIVar4 = (GImGui->CurrentWindowStack).Data[(long)(GImGui->CurrentWindowStack).Size + -2].Window;
    if ((pIVar4->DC).MenuBarAppending == true) {
      local_58.Min.y = (pIVar4->ClipRect).Min.y;
      local_58.Max.y = (pIVar4->ClipRect).Max.y;
      local_58.Max.x = 3.4028235e+38;
      local_58.Min.x = -3.4028235e+38;
    }
    else {
      fVar6 = (GImGui->Style).ItemInnerSpacing.x;
      fVar7 = (pIVar4->Pos).x;
      local_58.Min.x = fVar6 + fVar7;
      local_58.Max.x = ((fVar7 + (pIVar4->Size).x) - fVar6) - (pIVar4->ScrollbarSizes).x;
      local_58.Max.y = 3.4028235e+38;
      local_58.Min.y = -3.4028235e+38;
    }
LAB_00188c77:
    ref_pos = &window->Pos;
    policy = ImGuiPopupPositionPolicy_Default;
  }
  IVar1 = FindBestWindowPosForPopupEx
                    (ref_pos,&window->Size,&window->AutoPosLastDirection,&local_38,&local_58,policy)
  ;
  fVar6 = IVar1.x;
  fVar7 = IVar1.y;
LAB_00188c87:
  IVar1.y = fVar7;
  IVar1.x = fVar6;
  return IVar1;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = GetPopupAllowedExtentRect(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        IM_ASSERT(g.CurrentWindow == window);
        ImGuiWindow* parent_window = g.CurrentWindowStack[g.CurrentWindowStack.Size - 2].Window;
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->ClipRect.Min.y, FLT_MAX, parent_window->ClipRect.Max.y); // Avoid parent menu-bar. If we wanted multi-line menu-bar, we may instead want to have the calling window setup e.g. a NextWindowData.PosConstraintAvoidRect field
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, ImRect(window->Pos, window->Pos), ImGuiPopupPositionPolicy_Default); // Ideally we'd disable r_avoid here
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse + clamp within outer boundaries)
        // Note that drag and drop tooltips are NOT using this path: BeginTooltipEx() manually sets their position.
        // In theory we could handle both cases in same location, but requires a bit of shuffling as drag and drop tooltips are calling SetWindowPos() leading to 'window_pos_set_by_api' being set in Begin()
        IM_ASSERT(g.CurrentWindow == window);
        const float scale = g.Style.MouseCursorScale;
        const ImVec2 ref_pos = NavCalcPreferredRefPos();
        const ImVec2 tooltip_pos = ref_pos + TOOLTIP_DEFAULT_OFFSET * scale;
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * scale, ref_pos.y + 24 * scale); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        //GetForegroundDrawList()->AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255, 0, 255, 255));
        return FindBestWindowPosForPopupEx(tooltip_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Tooltip);
    }
    IM_ASSERT(0);
    return window->Pos;
}